

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::MaterialNode> *mnode)

{
  mapped_type_conflict1 mVar1;
  long lVar2;
  MaterialNode *pMVar3;
  Ref<embree::MetalMaterial> RVar4;
  long *plVar5;
  bool bVar6;
  ostream *poVar7;
  mapped_type_conflict1 *pmVar8;
  XMLWriter *this_00;
  runtime_error *this_01;
  long *in_RSI;
  long in_RDI;
  undefined1 uVar9;
  Ref<embree::HairMaterial> m_9;
  Ref<embree::MetalMaterial> m_8;
  Ref<embree::MirrorMaterial> m_7;
  Ref<embree::MatteMaterial> m_6;
  Ref<embree::MetallicPaintMaterial> m_5;
  Ref<embree::DielectricMaterial> m_4;
  Ref<embree::VelvetMaterial> m_3;
  Ref<embree::MetalMaterial> m_2;
  Ref<embree::ThinDielectricMaterial> m_1;
  Ref<embree::OBJMaterial> m;
  ssize_t id;
  Ref<embree::SceneGraph::Node> node;
  map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
  *in_stack_fffffffffffff7d8;
  XMLWriter *in_stack_fffffffffffff7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e8;
  key_type *in_stack_fffffffffffff818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  char *in_stack_fffffffffffff828;
  long *local_740;
  ssize_t in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  XMLWriter *in_stack_fffffffffffff8f0;
  Ref<embree::MetalMaterial> *material;
  XMLWriter *in_stack_fffffffffffff8f8;
  long *local_6d0;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  Ref<embree::OBJMaterial> *in_stack_fffffffffffff960;
  XMLWriter *in_stack_fffffffffffff968;
  long *local_660;
  long *local_628;
  long *local_5f0;
  long *local_5b8;
  long *local_580;
  long *local_548;
  long *local_4d0;
  long *local_4c8;
  XMLWriter *local_4c0;
  Ref<embree::MetalMaterial> local_4b8;
  long *local_4b0;
  long *local_4a8;
  long *local_4a0;
  long *local_498;
  long *local_490;
  long *local_488;
  long *local_480;
  long *local_478;
  long *local_470;
  long *local_468;
  long *local_460;
  long *local_458;
  long *local_450;
  long *local_448;
  long *local_440;
  long *local_438;
  mapped_type_conflict1 local_430;
  undefined4 local_424;
  _Self local_420;
  _Self local_418;
  long *local_410 [3];
  string local_3f8 [32];
  string local_3d8 [48];
  long **local_3a8;
  long **local_388;
  long **local_378;
  long **local_370;
  long **local_368;
  long **local_360;
  long **local_358;
  long **local_348;
  long **local_330;
  long **local_328;
  long **local_320;
  long **local_318;
  long **local_310;
  long **local_300;
  Ref<embree::MetalMaterial> *local_2e8;
  long **local_2d8;
  Ref<embree::MetalMaterial> *local_2d0;
  long **local_2c8;
  long **local_2c0;
  long **local_2b8;
  Ref<embree::MetalMaterial> *local_2b0;
  XMLWriter **local_2a8;
  long **local_2a0;
  XMLWriter **local_290;
  Ref<embree::MetalMaterial> *local_280;
  long **local_270;
  long **local_258;
  long **local_250;
  long **local_248;
  long **local_240;
  long **local_238;
  long **local_228;
  long **local_210;
  long **local_208;
  long **local_200;
  long **local_1f8;
  long **local_1f0;
  long **local_1e0;
  long **local_1c8;
  long **local_1c0;
  long **local_1b8;
  long **local_1b0;
  long **local_1a8;
  long **local_198;
  long **local_180;
  long **local_178;
  long **local_170;
  long **local_168;
  long **local_160;
  long **local_150;
  long **local_138;
  long **local_130;
  long **local_128;
  long **local_120;
  long **local_118;
  long **local_108;
  long **local_f0;
  long **local_e8;
  long **local_e0;
  long **local_d8;
  long **local_d0;
  long **local_c0;
  long *local_b0;
  long **local_a8;
  long *local_a0;
  long **local_98;
  long *local_90;
  long **local_88;
  long *local_80;
  long **local_78;
  XMLWriter *local_70;
  Ref<embree::MetalMaterial> *local_68;
  long *local_60;
  long **local_58;
  long *local_50;
  long **local_48;
  long *local_40;
  long **local_38;
  long *local_30;
  long **local_28;
  long *local_20;
  long **local_18;
  long *local_10;
  long **local_8;
  
  if ((*(byte *)(in_RDI + 0x491) & 1) == 0) {
    local_388 = local_410;
    local_b0 = (long *)*in_RSI;
    local_a8 = local_410;
    local_410[0] = local_b0;
    if (local_b0 != (long *)0x0) {
      (**(code **)(*local_b0 + 0x10))();
    }
    local_418._M_node =
         (_Base_ptr)
         std::
         map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
         ::find(in_stack_fffffffffffff7d8,(key_type *)0x3ef6a4);
    local_420._M_node =
         (_Base_ptr)
         std::
         map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
         ::end(in_stack_fffffffffffff7d8);
    bVar6 = std::operator!=(&local_418,&local_420);
    if (bVar6) {
      tab(in_stack_fffffffffffff7e0);
      poVar7 = std::operator<<((ostream *)(in_RDI + 0x10),"<material id=\"");
      pmVar8 = std::
               map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
               ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
                             *)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pmVar8);
      poVar7 = std::operator<<(poVar7,"\"/>");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_424 = 1;
    }
    else {
      mVar1 = *(mapped_type_conflict1 *)(in_RDI + 0x428);
      *(mapped_type_conflict1 *)(in_RDI + 0x428) = mVar1 + 1;
      pmVar8 = std::
               map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
               ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
                             *)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      *pmVar8 = mVar1;
      local_378 = &local_438;
      local_430 = mVar1;
      if (*in_RSI == 0) {
        local_548 = (long *)0x0;
      }
      else {
        local_548 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo,
                                           &OBJMaterial::typeinfo,0);
      }
      local_98 = &local_438;
      local_a0 = local_548;
      local_438 = local_548;
      if (local_548 != (long *)0x0) {
        (**(code **)(*local_548 + 0x10))();
      }
      local_370 = &local_438;
      if (local_438 == (long *)0x0) {
        local_330 = &local_448;
        if (*in_RSI == 0) {
          local_580 = (long *)0x0;
        }
        else {
          local_580 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo,
                                             &ThinDielectricMaterial::typeinfo,0);
        }
        local_88 = &local_448;
        local_90 = local_580;
        local_448 = local_580;
        if (local_580 != (long *)0x0) {
          (**(code **)(*local_580 + 0x10))();
        }
        local_328 = &local_448;
        if (local_448 == (long *)0x0) {
          local_2d8 = &local_458;
          if (*in_RSI == 0) {
            local_5b8 = (long *)0x0;
          }
          else {
            local_5b8 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo,
                                               &MetalMaterial::typeinfo,0);
          }
          local_78 = &local_458;
          local_80 = local_5b8;
          local_458 = local_5b8;
          if (local_5b8 != (long *)0x0) {
            (**(code **)(*local_5b8 + 0x10))();
          }
          local_2c8 = &local_458;
          if (local_458 == (long *)0x0) {
            local_258 = &local_468;
            if (*in_RSI == 0) {
              local_5f0 = (long *)0x0;
            }
            else {
              local_5f0 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo,
                                                 &VelvetMaterial::typeinfo,0);
            }
            local_58 = &local_468;
            local_60 = local_5f0;
            local_468 = local_5f0;
            if (local_5f0 != (long *)0x0) {
              (**(code **)(*local_5f0 + 0x10))();
            }
            local_250 = &local_468;
            if (local_468 == (long *)0x0) {
              local_210 = &local_478;
              if (*in_RSI == 0) {
                local_628 = (long *)0x0;
              }
              else {
                local_628 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo,
                                                   &DielectricMaterial::typeinfo,0);
              }
              local_48 = &local_478;
              local_50 = local_628;
              local_478 = local_628;
              if (local_628 != (long *)0x0) {
                (**(code **)(*local_628 + 0x10))();
              }
              local_208 = &local_478;
              if (local_478 == (long *)0x0) {
                local_1c8 = &local_488;
                if (*in_RSI == 0) {
                  local_660 = (long *)0x0;
                }
                else {
                  local_660 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo,
                                                     &MetallicPaintMaterial::typeinfo,0);
                }
                local_38 = &local_488;
                local_40 = local_660;
                local_488 = local_660;
                if (local_660 != (long *)0x0) {
                  (**(code **)(*local_660 + 0x10))();
                }
                local_1c0 = &local_488;
                if (local_488 == (long *)0x0) {
                  local_180 = &local_498;
                  if (*in_RSI == 0) {
                    local_30 = (long *)0x0;
                  }
                  else {
                    local_30 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo,
                                                      &MatteMaterial::typeinfo,0);
                  }
                  local_28 = &local_498;
                  plVar5 = local_30;
                  if (local_30 != (long *)0x0) {
                    lVar2 = *local_498;
                    local_498 = local_30;
                    (**(code **)(lVar2 + 0x10))();
                    plVar5 = local_498;
                  }
                  local_498 = plVar5;
                  local_178 = &local_498;
                  if (local_498 == (long *)0x0) {
                    local_138 = &local_4a8;
                    if (*in_RSI == 0) {
                      local_6d0 = (long *)0x0;
                    }
                    else {
                      local_6d0 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo
                                                         ,&MirrorMaterial::typeinfo,0);
                    }
                    local_18 = &local_4a8;
                    local_20 = local_6d0;
                    local_4a8 = local_6d0;
                    if (local_6d0 != (long *)0x0) {
                      (**(code **)(*local_6d0 + 0x10))();
                    }
                    local_130 = &local_4a8;
                    if (local_4a8 == (long *)0x0) {
                      local_2e8 = &local_4b8;
                      if (*in_RSI == 0) {
                        this_00 = (XMLWriter *)0x0;
                      }
                      else {
                        this_00 = (XMLWriter *)
                                  __dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::typeinfo,
                                                 &MetalMaterial::typeinfo,0);
                      }
                      material = &local_4b8;
                      local_70 = this_00;
                      local_68 = material;
                      RVar4.ptr = (MetalMaterial *)this_00;
                      if (this_00 != (XMLWriter *)0x0) {
                        pMVar3 = &(local_4b8.ptr)->super_MaterialNode;
                        local_4b8.ptr = (MetalMaterial *)this_00;
                        (*(pMVar3->super_Node).super_RefCount._vptr_RefCount[2])();
                        RVar4.ptr = local_4b8.ptr;
                      }
                      local_4b8.ptr = RVar4.ptr;
                      local_2d0 = &local_4b8;
                      uVar9 = (XMLWriter *)local_4b8.ptr != (XMLWriter *)0x0;
                      if ((bool)uVar9) {
                        local_2a8 = &local_4c0;
                        local_2b0 = &local_4b8;
                        local_4c0 = (XMLWriter *)local_4b8.ptr;
                        if ((XMLWriter *)local_4b8.ptr != (XMLWriter *)0x0) {
                          (*((local_4b8.ptr)->super_MaterialNode).super_Node.super_RefCount.
                            _vptr_RefCount[2])();
                        }
                        store(this_00,material,CONCAT17(uVar9,in_stack_fffffffffffff8e8));
                        local_290 = &local_4c0;
                        if (local_4c0 != (XMLWriter *)0x0) {
                          (**(code **)(*(long *)local_4c0 + 0x18))();
                        }
                      }
                      else {
                        local_f0 = &local_4c8;
                        if (*in_RSI == 0) {
                          local_740 = (long *)0x0;
                        }
                        else {
                          local_740 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::MaterialNode::
                                                                      typeinfo,
                                                             &HairMaterial::typeinfo,0);
                        }
                        local_8 = &local_4c8;
                        local_10 = local_740;
                        local_4c8 = local_740;
                        if (local_740 != (long *)0x0) {
                          (**(code **)(*local_740 + 0x10))();
                        }
                        local_e8 = &local_4c8;
                        if (local_4c8 == (long *)0x0) {
                          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_01,"unsupported material");
                          __cxa_throw(this_01,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        local_d8 = &local_4d0;
                        local_e0 = &local_4c8;
                        local_4d0 = local_4c8;
                        if (local_4c8 != (long *)0x0) {
                          (**(code **)(*local_4c8 + 0x10))();
                        }
                        store(this_00,(Ref<embree::HairMaterial> *)material,
                              CONCAT17(uVar9,in_stack_fffffffffffff8e8));
                        local_d0 = &local_4d0;
                        if (local_4d0 != (long *)0x0) {
                          (**(code **)(*local_4d0 + 0x18))();
                        }
                        local_c0 = &local_4c8;
                        if (local_4c8 != (long *)0x0) {
                          (**(code **)(*local_4c8 + 0x18))();
                        }
                      }
                      local_280 = &local_4b8;
                      if ((XMLWriter *)local_4b8.ptr != (XMLWriter *)0x0) {
                        (*((local_4b8.ptr)->super_MaterialNode).super_Node.super_RefCount.
                          _vptr_RefCount[3])();
                      }
                    }
                    else {
                      local_120 = &local_4b0;
                      local_128 = &local_4a8;
                      local_4b0 = local_4a8;
                      if (local_4a8 != (long *)0x0) {
                        (**(code **)(*local_4a8 + 0x10))();
                      }
                      store(in_stack_fffffffffffff8f0,
                            (Ref<embree::MirrorMaterial> *)
                            CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
                            in_stack_fffffffffffff8e0);
                      local_118 = &local_4b0;
                      if (local_4b0 != (long *)0x0) {
                        (**(code **)(*local_4b0 + 0x18))();
                      }
                    }
                    local_108 = &local_4a8;
                    if (local_4a8 != (long *)0x0) {
                      (**(code **)(*local_4a8 + 0x18))();
                    }
                  }
                  else {
                    local_168 = &local_4a0;
                    local_170 = &local_498;
                    local_4a0 = local_498;
                    if (local_498 != (long *)0x0) {
                      (**(code **)(*local_498 + 0x10))();
                    }
                    store(in_stack_fffffffffffff8f0,
                          (Ref<embree::MatteMaterial> *)
                          CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
                          in_stack_fffffffffffff8e0);
                    local_160 = &local_4a0;
                    if (local_4a0 != (long *)0x0) {
                      (**(code **)(*local_4a0 + 0x18))();
                    }
                  }
                  local_150 = &local_498;
                  if (local_498 != (long *)0x0) {
                    (**(code **)(*local_498 + 0x18))();
                  }
                }
                else {
                  local_1b0 = &local_490;
                  local_1b8 = &local_488;
                  local_490 = local_488;
                  if (local_488 != (long *)0x0) {
                    (**(code **)(*local_488 + 0x10))();
                  }
                  store(in_stack_fffffffffffff8f8,
                        (Ref<embree::MetallicPaintMaterial> *)in_stack_fffffffffffff8f0,
                        CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
                  local_1a8 = &local_490;
                  if (local_490 != (long *)0x0) {
                    (**(code **)(*local_490 + 0x18))();
                  }
                }
                local_198 = &local_488;
                if (local_488 != (long *)0x0) {
                  (**(code **)(*local_488 + 0x18))();
                }
              }
              else {
                local_1f8 = &local_480;
                local_200 = &local_478;
                local_480 = local_478;
                if (local_478 != (long *)0x0) {
                  (**(code **)(*local_478 + 0x10))();
                }
                store(in_stack_fffffffffffff8f8,
                      (Ref<embree::DielectricMaterial> *)in_stack_fffffffffffff8f0,
                      CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
                local_1f0 = &local_480;
                if (local_480 != (long *)0x0) {
                  (**(code **)(*local_480 + 0x18))();
                }
              }
              local_1e0 = &local_478;
              if (local_478 != (long *)0x0) {
                (**(code **)(*local_478 + 0x18))();
              }
            }
            else {
              local_240 = &local_470;
              local_248 = &local_468;
              local_470 = local_468;
              if (local_468 != (long *)0x0) {
                (**(code **)(*local_468 + 0x10))();
              }
              store(in_stack_fffffffffffff8f8,
                    (Ref<embree::VelvetMaterial> *)in_stack_fffffffffffff8f0,
                    CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
              local_238 = &local_470;
              if (local_470 != (long *)0x0) {
                (**(code **)(*local_470 + 0x18))();
              }
            }
            local_228 = &local_468;
            if (local_468 != (long *)0x0) {
              (**(code **)(*local_468 + 0x18))();
            }
          }
          else {
            local_2b8 = &local_460;
            local_2c0 = &local_458;
            local_460 = local_458;
            if (local_458 != (long *)0x0) {
              (**(code **)(*local_458 + 0x10))();
            }
            store(in_stack_fffffffffffff8f8,(Ref<embree::MetalMaterial> *)in_stack_fffffffffffff8f0,
                  CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
            local_2a0 = &local_460;
            if (local_460 != (long *)0x0) {
              (**(code **)(*local_460 + 0x18))();
            }
          }
          local_270 = &local_458;
          if (local_458 != (long *)0x0) {
            (**(code **)(*local_458 + 0x18))();
          }
        }
        else {
          local_318 = &local_450;
          local_320 = &local_448;
          local_450 = local_448;
          if (local_448 != (long *)0x0) {
            (**(code **)(*local_448 + 0x10))();
          }
          store(in_stack_fffffffffffff8f0,
                (Ref<embree::ThinDielectricMaterial> *)
                CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
                in_stack_fffffffffffff8e0);
          local_310 = &local_450;
          if (local_450 != (long *)0x0) {
            (**(code **)(*local_450 + 0x18))();
          }
        }
        local_300 = &local_448;
        if (local_448 != (long *)0x0) {
          (**(code **)(*local_448 + 0x18))();
        }
      }
      else {
        local_360 = &local_440;
        local_368 = &local_438;
        local_440 = local_438;
        if (local_438 != (long *)0x0) {
          (**(code **)(*local_438 + 0x10))();
        }
        store(in_stack_fffffffffffff968,in_stack_fffffffffffff960,
              CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
        local_358 = &local_440;
        if (local_440 != (long *)0x0) {
          (**(code **)(*local_440 + 0x18))();
        }
      }
      local_348 = &local_438;
      if (local_438 != (long *)0x0) {
        (**(code **)(*local_438 + 0x18))();
      }
      local_424 = 0;
    }
    local_3a8 = local_410;
    if (local_410[0] != (long *)0x0) {
      (**(code **)(*local_410[0] + 0x18))();
    }
  }
  else {
    tab(in_stack_fffffffffffff7e0);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    std::operator+(in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
    poVar7 = std::operator<<((ostream *)(in_RDI + 0x10),local_3d8);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3d8);
    std::__cxx11::string::~string(local_3f8);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::MaterialNode> mnode)
  {
    /* let materials reference by their name, allows separate bindings of materials */
    if (referenceMaterials) {
      tab(); xml << "<material id=\""+mnode->name+"\"/>" << std::endl;
      return;
    }
    
    Ref<SceneGraph::Node> node = mnode.dynamicCast<SceneGraph::Node>();
    if (nodeMap.find(node) != nodeMap.end()) {
      tab(); xml << "<material id=\"" << nodeMap[node] << "\"/>" << std::endl;
      return;
    }
    const ssize_t id = nodeMap[node] = currentNodeID++;

    if      (Ref<OBJMaterial> m = mnode.dynamicCast<OBJMaterial>()) store(m,id);
    else if (Ref<ThinDielectricMaterial> m = mnode.dynamicCast<ThinDielectricMaterial>()) store(m,id);
    else if (Ref<MetalMaterial> m = mnode.dynamicCast<MetalMaterial>()) store(m,id);
    else if (Ref<VelvetMaterial> m = mnode.dynamicCast<VelvetMaterial>()) store(m,id);
    else if (Ref<DielectricMaterial> m = mnode.dynamicCast<DielectricMaterial>()) store(m,id);
    else if (Ref<MetallicPaintMaterial> m = mnode.dynamicCast<MetallicPaintMaterial>()) store(m,id);
    else if (Ref<MatteMaterial> m = mnode.dynamicCast<MatteMaterial>()) store(m,id);
    else if (Ref<MirrorMaterial> m = mnode.dynamicCast<MirrorMaterial>()) store(m,id);
    else if (Ref<ReflectiveMetalMaterial> m = mnode.dynamicCast<ReflectiveMetalMaterial>()) store(m,id);
    else if (Ref<HairMaterial> m = mnode.dynamicCast<HairMaterial>()) store(m,id);
    else throw std::runtime_error("unsupported material");
  }